

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

ostream * Json::operator<<(ostream *sout,Value *root)

{
  size_t in_RCX;
  void *in_RSI;
  ostream *in_RDI;
  StyledStreamWriter writer;
  StyledStreamWriter *this;
  allocator<char> local_a1;
  string local_a0 [8];
  string *in_stack_ffffffffffffff68;
  StyledStreamWriter *in_stack_ffffffffffffff70;
  StyledStreamWriter local_80;
  void *local_10;
  ostream *local_8;
  
  this = (StyledStreamWriter *)&local_a1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"\t",(allocator *)this);
  StyledStreamWriter::StyledStreamWriter(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  StyledStreamWriter::write(&local_80,(int)local_8,local_10,in_RCX);
  StyledStreamWriter::~StyledStreamWriter(this);
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& sout, const Value& root) {
  Json::StyledStreamWriter writer;
  writer.write(sout, root);
  return sout;
}